

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,int N_)

{
  pointer pqVar1;
  ulong uVar2;
  
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->N = N_;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize(&this->bits,(long)N_);
  pqVar1 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (*(int *)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_finish != (int)pqVar1) {
    uVar2 = 0;
    do {
      pqVar1[uVar2].value = '\0';
      uVar2 = uVar2 + 1;
      pqVar1 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (uint)(*(int *)&(this->bits).
                                     super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (int)pqVar1));
  }
  return;
}

Assistant:

quad_value_bit_vector(const int N_) : N(N_) {
      //bits.resize(NUM_BYTES(N));
      bits.resize(N);
      for (uint i = 0; i < ((uint) bits.size()); i++) {
	bits[i] = quad_value(0);
      }
      
      // for (int i = 0; i < N; i++) {
      //   set(i, 0);
      // }
    }